

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_subject_entry.cpp
# Opt level: O2

void __thiscall
duckdb::DependencySubjectEntry::DependencySubjectEntry
          (DependencySubjectEntry *this,Catalog *catalog,DependencyInfo *info)

{
  MangledEntryName MStack_78;
  MangledEntryName local_58;
  MangledDependencyName local_38;
  
  DependencyManager::MangleName(&local_58,(CatalogEntryInfo *)info);
  DependencyManager::MangleName(&MStack_78,&(info->subject).entry);
  MangledDependencyName::MangledDependencyName(&local_38,&local_58,&MStack_78);
  DependencyEntry::DependencyEntry(&this->super_DependencyEntry,catalog,SUBJECT,&local_38,info);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&MStack_78);
  ::std::__cxx11::string::~string((string *)&local_58);
  (this->super_DependencyEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry =
       (_func_int **)&PTR__DependencyDependentEntry_017987f8;
  return;
}

Assistant:

DependencySubjectEntry::DependencySubjectEntry(Catalog &catalog, const DependencyInfo &info)
    : DependencyEntry(catalog, DependencyEntryType::SUBJECT,
                      MangledDependencyName(DependencyManager::MangleName(info.dependent.entry),
                                            DependencyManager::MangleName(info.subject.entry)),
                      info) {
}